

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O1

cupdlp_retcode PDHG_Power_Method(CUPDLPwork *work,cupdlp_float *lambda)

{
  CUPDLPdata *pCVar1;
  CUPDLPiterates *pCVar2;
  CUPDLPvec *ax;
  CUPDLPvec *x;
  cupdlp_float *x_00;
  cupdlp_float *pcVar3;
  int iVar4;
  cupdlp_int iter;
  uint uVar5;
  ulong uVar6;
  cupdlp_float qNorm;
  double res;
  cupdlp_float alpha;
  cupdlp_float local_68;
  cupdlp_float local_60;
  CUPDLPvec *local_58;
  CUPDLPvec *local_50;
  cupdlp_float *local_48;
  cupdlp_float *local_40;
  cupdlp_float local_38;
  
  pCVar1 = work->problem->data;
  pCVar2 = work->iterates;
  local_40 = lambda;
  if (0 < work->settings->nLogLevel) {
    puts("Power Method:");
  }
  local_48 = work->buffer->data;
  cupdlp_initvec(local_48,1.0,pCVar1->nRows);
  x_00 = local_48;
  iVar4 = work->timers->nIter % 2;
  ax = pCVar2->ax[iVar4];
  local_58 = pCVar2->aty[iVar4];
  local_60 = 0.0;
  uVar6 = 0;
  local_50 = ax;
  do {
    x = local_58;
    ATy(work,local_58,work->buffer);
    Ax(work,ax,x);
    memcpy(x_00,ax->data,(long)pCVar1->nRows << 3);
    local_68 = 0.0;
    cupdlp_twoNorm(work,pCVar1->nRows,x_00,&local_68);
    cupdlp_scaleVector(work,1.0 / local_68,x_00,pCVar1->nRows);
    ATy(work,x,work->buffer);
    pcVar3 = local_40;
    cupdlp_twoNormSquared(work,pCVar1->nCols,x->data,local_40);
    local_38 = -*pcVar3;
    cupdlp_axpy(work,pCVar1->nRows,&local_38,x_00,ax->data);
    cupdlp_twoNormSquared(work,pCVar1->nCols,ax->data,&local_60);
    if (0 < work->settings->nLogLevel) {
      printf("% d  %e  %.3f\n",*pcVar3,local_60,uVar6);
    }
    uVar5 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar5;
  } while (uVar5 != 0x14);
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Power_Method(CUPDLPwork *work, cupdlp_float *lambda) {
  cupdlp_retcode retcode = RETCODE_OK;
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPiterates *iterates = work->iterates;

  if (work->settings->nLogLevel>0) 
    cupdlp_printf("Power Method:\n");

  cupdlp_float *q = work->buffer->data;

  cupdlp_initvec(q, 1.0, lp->nRows);

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  double res = 0.0;
  for (cupdlp_int iter = 0; iter < 20; ++iter) {
    // z = A*A'*q
    ATy(work, aty, work->buffer);
    Ax(work, ax, aty);

    // q = z / norm(z)
    CUPDLP_COPY_VEC(q, ax->data, cupdlp_float, lp->nRows);
    cupdlp_float qNorm = 0.0;
    cupdlp_twoNorm(work, lp->nRows, q, &qNorm);
    cupdlp_scaleVector(work, 1.0 / qNorm, q, lp->nRows);

    ATy(work, aty, work->buffer);

    cupdlp_twoNormSquared(work, lp->nCols, aty->data, lambda);

    cupdlp_float alpha = -(*lambda);
    cupdlp_axpy(work, lp->nRows, &alpha, q, ax->data);

    cupdlp_twoNormSquared(work, lp->nCols, ax->data, &res);

     if (work->settings->nLogLevel>0) 
      cupdlp_printf("% d  %e  %.3f\n", iter, *lambda, res);
  }

exit_cleanup:
  return retcode;
}